

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_header.c
# Opt level: O3

exr_result_t save_m44f(exr_context_t ctxt,exr_attribute_t *a)

{
  exr_result_t eVar1;
  int32_t isz;
  exr_attr_m44f_t tmp;
  undefined4 local_5c;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  exr_attribute_type_t eStack_44;
  float fStack_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined4 local_28;
  exr_attribute_type_t eStack_24;
  float fStack_20;
  undefined4 uStack_1c;
  
  local_58 = *(undefined4 *)&a->name;
  uStack_54 = *(undefined4 *)((long)&a->name + 4);
  uStack_50 = *(undefined4 *)&a->type_name;
  uStack_4c = *(undefined4 *)((long)&a->type_name + 4);
  local_48._0_1_ = a->name_length;
  local_48._1_1_ = a->type_name_length;
  local_48._2_1_ = a->pad[0];
  local_48._3_1_ = a->pad[1];
  eStack_44 = a->type;
  fStack_40 = (a->field_6).f;
  uStack_3c = *(undefined4 *)((long)&a->field_6 + 4);
  local_38 = *(undefined4 *)&a[1].name;
  uStack_34 = *(undefined4 *)((long)&a[1].name + 4);
  uStack_30 = *(undefined4 *)&a[1].type_name;
  uStack_2c = *(undefined4 *)((long)&a[1].type_name + 4);
  local_28._0_1_ = a[1].name_length;
  local_28._1_1_ = a[1].type_name_length;
  local_28._2_1_ = a[1].pad[0];
  local_28._3_1_ = a[1].pad[1];
  eStack_24 = a[1].type;
  fStack_20 = a[1].field_6.f;
  uStack_1c = *(undefined4 *)((long)&a[1].field_6 + 4);
  local_5c = 0x40;
  eVar1 = (*ctxt->do_write)(ctxt,&local_5c,4,&ctxt->output_file_offset);
  if (eVar1 == 0) {
    eVar1 = (*ctxt->do_write)(ctxt,&local_58,0x40,&ctxt->output_file_offset);
  }
  return eVar1;
}

Assistant:

static exr_result_t
save_m44f (exr_context_t ctxt, const exr_attribute_t* a)
{
    exr_result_t    rv;
    exr_attr_m44f_t tmp = *(a->m44f);

    rv = save_attr_sz (ctxt, sizeof (exr_attr_m44f_t));
    if (rv == EXR_ERR_SUCCESS) rv = save_attr_32 (ctxt, &tmp, 16);
    return rv;
}